

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionControlElement::~IfcDistributionControlElement
          (IfcDistributionControlElement *this)

{
  ~IfcDistributionControlElement((IfcDistributionControlElement *)&this[-1].field_0x50);
  return;
}

Assistant:

IfcDistributionControlElement() : Object("IfcDistributionControlElement") {}